

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int nodeReaderInit(NodeReader *p,char *aNode,int nNode)

{
  int iVar1;
  
  p->nNode = 0;
  p->iOff = 0;
  p->iChild = 0;
  p->aDoclist = (char *)0x0;
  *(undefined8 *)&p->nDoclist = 0;
  (p->term).a = (char *)0x0;
  (p->term).n = 0;
  (p->term).nAlloc = 0;
  p->aNode = aNode;
  p->nNode = nNode;
  if (*aNode == '\0') {
    iVar1 = 1;
  }
  else {
    iVar1 = sqlite3Fts3GetVarint(aNode + 1,&p->iChild);
    iVar1 = iVar1 + 1;
  }
  p->iOff = iVar1;
  iVar1 = nodeReaderNext(p);
  return iVar1;
}

Assistant:

static int nodeReaderInit(NodeReader *p, const char *aNode, int nNode){
  memset(p, 0, sizeof(NodeReader));
  p->aNode = aNode;
  p->nNode = nNode;

  /* Figure out if this is a leaf or an internal node. */
  if( p->aNode[0] ){
    /* An internal node. */
    p->iOff = 1 + sqlite3Fts3GetVarint(&p->aNode[1], &p->iChild);
  }else{
    p->iOff = 1;
  }

  return nodeReaderNext(p);
}